

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void pbrt::SetSearchDirectory(string *filename)

{
  undefined1 uVar1;
  path *in_stack_00000008;
  path *in_stack_00000038;
  path path;
  path *path_00;
  undefined7 in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa8;
  path *in_stack_ffffffffffffffb0;
  path local_30;
  
  path_00 = &local_30;
  filesystem::path::path(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  uVar1 = filesystem::path::is_directory(in_stack_00000038);
  if (!(bool)uVar1) {
    filesystem::path::parent_path(in_stack_00000008);
    filesystem::path::operator=((path *)CONCAT17(uVar1,in_stack_ffffffffffffff90),path_00);
    filesystem::path::~path((path *)0x544db1);
  }
  filesystem::path::operator=((path *)CONCAT17(uVar1,in_stack_ffffffffffffff90),path_00);
  filesystem::path::~path((path *)0x544dfa);
  return;
}

Assistant:

void SetSearchDirectory(const std::string &filename) {
    filesystem::path path(filename);
    if (!path.is_directory())
        path = path.parent_path();
    searchDirectory = path;
}